

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_esis.c
# Opt level: O2

int parse_esis(int *arr_sz,int *reserved_sz,uint32_t **esi_arr,char *p)

{
  char cVar1;
  char *in_RAX;
  long lVar2;
  long lVar3;
  ushort **ppuVar4;
  char *pcVar5;
  char *endptr;
  char *local_38;
  
  local_38 = in_RAX;
  do {
    lVar2 = strtol(p,&local_38,0);
    pcVar5 = local_38;
    if (local_38 == p) {
      return 0;
    }
    if (*local_38 == '-') {
      lVar3 = strtol(local_38 + 1,&local_38,0);
      pcVar5 = local_38;
      for (; lVar2 <= lVar3; lVar2 = lVar2 + 1) {
        append(arr_sz,reserved_sz,esi_arr,(uint32_t)lVar2);
      }
    }
    else {
      append(arr_sz,reserved_sz,esi_arr,(uint32_t)lVar2);
    }
    while( true ) {
      cVar1 = *pcVar5;
      if ((long)cVar1 == 0) break;
      ppuVar4 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) == 0) break;
      pcVar5 = pcVar5 + 1;
    }
    p = pcVar5 + (cVar1 == ',');
  } while( true );
}

Assistant:

int parse_esis(int* arr_sz,
		int* reserved_sz,
		uint32_t** esi_arr,
		const char* p)
{
	do {
		char* endptr;
		long int v = strtol(p, &endptr, 0);
		if (endptr == p)
			break;
		p = endptr;
		if (*p == '-') {
			/* A range was given, find the end value and
			 * place the entire range in the array.
			 */
			long int ve = strtol(p + 1, &endptr, 0);
			p = endptr;
			while (v <= ve) {
				append(arr_sz, reserved_sz, esi_arr, v);
				++v;
			}
		} else {
			append(arr_sz, reserved_sz, esi_arr, v);
		}
		while (*p != '\0' && isspace(*p))
			++p;
		if (*p == ',')
			++p;
	} while(1);

	return 0;
}